

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r3d.hpp
# Opt level: O0

int __thiscall r3d::init(r3d *this,EVP_PKEY_CTX *ctx)

{
  Vector<3> *rhs;
  r3d *prVar1;
  uint local_1c;
  Int v;
  Few<r3d::Vector<3>,_4> *verts_local;
  Polytope<3> *poly_local;
  
  *(undefined4 *)(this + 0x1400) = 4;
  *(undefined4 *)this = 1;
  *(undefined4 *)(this + 4) = 3;
  *(undefined4 *)(this + 8) = 2;
  *(undefined4 *)(this + 0x28) = 2;
  *(undefined4 *)(this + 0x2c) = 3;
  *(undefined4 *)(this + 0x30) = 0;
  *(undefined4 *)(this + 0x50) = 0;
  *(undefined4 *)(this + 0x54) = 3;
  *(undefined4 *)(this + 0x58) = 1;
  *(undefined4 *)(this + 0x78) = 1;
  *(undefined4 *)(this + 0x7c) = 2;
  *(undefined4 *)(this + 0x80) = 0;
  local_1c = 0;
  prVar1 = this;
  while ((int)local_1c < 4) {
    rhs = Few<r3d::Vector<3>,_4>::operator[]((Few<r3d::Vector<3>,_4> *)ctx,local_1c);
    Vector<3>::operator=((Vector<3> *)(this + (long)(int)local_1c * 0x28 + 0x10),rhs);
    local_1c = local_1c + 1;
    prVar1 = (r3d *)(ulong)local_1c;
  }
  return (int)prVar1;
}

Assistant:

R3D_INLINE void init(Polytope<3>& poly, Few<Vector<3>, 4> verts) {
  // initialize graph connectivity
  poly.nverts = 4;
  poly.verts[0].pnbrs[0] = 1;
  poly.verts[0].pnbrs[1] = 3;
  poly.verts[0].pnbrs[2] = 2;
  poly.verts[1].pnbrs[0] = 2;
  poly.verts[1].pnbrs[1] = 3;
  poly.verts[1].pnbrs[2] = 0;
  poly.verts[2].pnbrs[0] = 0;
  poly.verts[2].pnbrs[1] = 3;
  poly.verts[2].pnbrs[2] = 1;
  poly.verts[3].pnbrs[0] = 1;
  poly.verts[3].pnbrs[1] = 2;
  poly.verts[3].pnbrs[2] = 0;

  // copy vertex coordinates
  for (Int v = 0; v < 4; ++v) poly.verts[v].pos = verts[v];
}